

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11_meta_dealloc(PyObject *obj)

{
  type_index tVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  pointer ppVar5;
  reference pptVar6;
  local_internals *this;
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::override_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  *this_00;
  pointer ppVar7;
  _Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true> local_58;
  iterator last;
  iterator it;
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::override_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  *cache;
  type_index tindex;
  type_info *tinfo;
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_28;
  iterator found_type;
  internals *internals;
  PyTypeObject *type;
  PyObject *obj_local;
  
  internals = (internals *)obj;
  type = (PyTypeObject *)obj;
  found_type.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             )pybind11::detail::get_internals();
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
       ::find((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
               *)((long)&(((__node_type *)
                          ((long)found_type.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x28))->
                         super__Hash_node_value<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>
                         ._M_storage._M_storage + 8),(key_type *)&internals);
  tinfo = (type_info *)
          std::
          unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
          ::end((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                 *)((long)found_type.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x38));
  bVar2 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                      *)&tinfo);
  bVar3 = false;
  if (bVar2) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                           *)&local_28);
    sVar4 = std::
            vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
            size(&ppVar5->second);
    bVar3 = false;
    if (sVar4 == 1) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                             *)&local_28);
      pptVar6 = std::
                vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                ::operator[](&ppVar5->second,0);
      bVar3 = (internals *)(*pptVar6)->type == internals;
    }
  }
  if (bVar3) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                           *)&local_28);
    pptVar6 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](&ppVar5->second,0);
    tindex._M_target = (type_info *)*pptVar6;
    std::type_index::type_index((type_index *)&cache,((value_type)tindex._M_target)->cpptype);
    std::
    unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
    ::erase((unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
             *)((long)found_type.
                      super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                      ._M_cur + 0xe0),(key_type *)&cache);
    if (((byte)tindex._M_target[0x90] >> 3 & 1) == 0) {
      std::
      unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
      ::erase((unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
               *)found_type.
                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                 ._M_cur,(key_type *)&cache);
    }
    else {
      this = pybind11::detail::get_local_internals();
      std::
      unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
      ::erase(&this->registered_types_cpp,(key_type *)&cache);
    }
    std::
    unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
    ::erase((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
             *)((long)found_type.
                      super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                      ._M_cur + 0x38),(key_type *)tindex._M_target);
    this_00 = (unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::override_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
               *)((long)found_type.
                        super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                        ._M_cur + 0xa8);
    last = std::
           unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::override_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
           ::begin(this_00);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::override_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
         ::end(this_00);
    while (bVar3 = std::__detail::operator!=
                             (&last.
                               super__Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true>
                              ,&local_58), tVar1 = tindex, bVar3) {
      ppVar7 = std::__detail::_Node_iterator<std::pair<const__object_*,_const_char_*>,_true,_true>::
               operator->(&last);
      if (ppVar7->first == *(_object **)tindex._M_target) {
        last = std::
               unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::override_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
               ::erase(this_00,last);
      }
      else {
        std::__detail::_Node_iterator<std::pair<const__object_*,_const_char_*>,_true,_true>::
        operator++(&last);
      }
    }
    if (tindex._M_target != (type_info *)0x0) {
      pybind11::detail::type_info::~type_info((type_info *)tindex._M_target);
      operator_delete(tVar1._M_target,0x98);
    }
  }
  (*_PyThreadState_New)(type);
  return;
}

Assistant:

inline void pybind11_meta_dealloc(PyObject *obj) {
    auto *type = (PyTypeObject *) obj;
    auto &internals = get_internals();

    // A pybind11-registered type will:
    // 1) be found in internals.registered_types_py
    // 2) have exactly one associated `detail::type_info`
    auto found_type = internals.registered_types_py.find(type);
    if (found_type != internals.registered_types_py.end() &&
        found_type->second.size() == 1 &&
        found_type->second[0]->type == type) {

        auto *tinfo = found_type->second[0];
        auto tindex = std::type_index(*tinfo->cpptype);
        internals.direct_conversions.erase(tindex);

        if (tinfo->module_local)
            get_local_internals().registered_types_cpp.erase(tindex);
        else
            internals.registered_types_cpp.erase(tindex);
        internals.registered_types_py.erase(tinfo->type);

        // Actually just `std::erase_if`, but that's only available in C++20
        auto &cache = internals.inactive_override_cache;
        for (auto it = cache.begin(), last = cache.end(); it != last; ) {
            if (it->first == (PyObject *) tinfo->type)
                it = cache.erase(it);
            else
                ++it;
        }

        delete tinfo;
    }

    PyType_Type.tp_dealloc(obj);
}